

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode Curl_creader_create(Curl_creader **preader,Curl_easy *data,Curl_crtype *crt,
                            Curl_creader_phase phase)

{
  Curl_creader *pCVar1;
  Curl_creader *local_48;
  void *p;
  Curl_creader *pCStack_30;
  CURLcode result;
  Curl_creader *reader;
  Curl_creader_phase phase_local;
  Curl_crtype *crt_local;
  Curl_easy *data_local;
  Curl_creader **preader_local;
  
  pCStack_30 = (Curl_creader *)0x0;
  p._4_4_ = CURLE_OUT_OF_MEMORY;
  pCVar1 = (Curl_creader *)(*Curl_ccalloc)(1,crt->creader_size);
  if (pCVar1 != (Curl_creader *)0x0) {
    pCVar1->crt = crt;
    pCVar1->ctx = pCVar1;
    pCVar1->phase = phase;
    p._4_4_ = (*crt->do_init)(data,pCVar1);
    pCStack_30 = pCVar1;
  }
  if (p._4_4_ == CURLE_OK) {
    local_48 = pCStack_30;
  }
  else {
    local_48 = (Curl_creader *)0x0;
  }
  *preader = local_48;
  if (p._4_4_ != CURLE_OK) {
    (*Curl_cfree)(pCStack_30);
  }
  return p._4_4_;
}

Assistant:

CURLcode Curl_creader_create(struct Curl_creader **preader,
                             struct Curl_easy *data,
                             const struct Curl_crtype *crt,
                             Curl_creader_phase phase)
{
  struct Curl_creader *reader = NULL;
  CURLcode result = CURLE_OUT_OF_MEMORY;
  void *p;

  DEBUGASSERT(crt->creader_size >= sizeof(struct Curl_creader));
  p = calloc(1, crt->creader_size);
  if(!p)
    goto out;

  reader = (struct Curl_creader *)p;
  reader->crt = crt;
  reader->ctx = p;
  reader->phase = phase;
  result = crt->do_init(data, reader);

out:
  *preader = result ? NULL : reader;
  if(result)
    free(reader);
  return result;
}